

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExportDirWrapper.cpp
# Opt level: O2

bool __thiscall ExportDirWrapper::wrap(ExportDirWrapper *this)

{
  uint uVar1;
  int iVar2;
  IMAGE_EXPORT_DIRECTORY *pIVar3;
  ExportEntryWrapper *this_00;
  undefined4 extraout_var;
  size_t entryNumber;
  ExportEntryWrapper *local_38;
  
  (*(this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
    super_ExeElementWrapper.super_AbstractByteBuffer._vptr_AbstractByteBuffer[0x2c])();
  mapNames(this);
  pIVar3 = exportDir(this);
  if (pIVar3 != (IMAGE_EXPORT_DIRECTORY *)0x0) {
    uVar1 = pIVar3->NumberOfFunctions;
    for (entryNumber = 0; uVar1 != entryNumber; entryNumber = entryNumber + 1) {
      this_00 = (ExportEntryWrapper *)operator_new(0x40);
      ExportEntryWrapper::ExportEntryWrapper
                (this_00,(this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
                         super_ExeElementWrapper.m_Exe,this,entryNumber);
      iVar2 = (*(this_00->super_ExeNodeWrapper).super_ExeElementWrapper.super_AbstractByteBuffer.
                _vptr_AbstractByteBuffer[0xc])(this_00);
      if (CONCAT44(extraout_var,iVar2) == 0) {
        (*(this_00->super_ExeNodeWrapper).super_ExeElementWrapper.super_AbstractByteBuffer.
          _vptr_AbstractByteBuffer[1])(this_00);
        break;
      }
      local_38 = this_00;
      std::vector<ExeNodeWrapper*,std::allocator<ExeNodeWrapper*>>::emplace_back<ExeNodeWrapper*>
                ((vector<ExeNodeWrapper*,std::allocator<ExeNodeWrapper*>> *)
                 &(this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.entries
                 ,(ExeNodeWrapper **)&local_38);
    }
  }
  return pIVar3 != (IMAGE_EXPORT_DIRECTORY *)0x0;
}

Assistant:

bool ExportDirWrapper::wrap()
{
    clear();
    mapNames();

    IMAGE_EXPORT_DIRECTORY* exp = exportDir();
    if (exp == NULL) return 0;

    size_t maxFunc = exp->NumberOfFunctions;

    for (size_t i = 0; i < maxFunc; i++) {
        //TODO: build entries...
        ExportEntryWrapper *entry = new ExportEntryWrapper(m_Exe, this, i);
        if (entry->getPtr() == NULL) {
            delete entry;
            break;
        }
        this->entries.push_back(entry);
    }
    return true;
}